

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:186:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:186:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> depResult;
  Exception local_5c8;
  NullableValue<kj::Exception> local_468;
  char local_308;
  size_t local_300;
  ExceptionOr<kj::String> local_2f8;
  Exception local_178;
  
  local_468.isSet = false;
  local_308 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_468);
  if (local_468.isSet == true) {
    Exception::Exception(&local_178,&local_468.field_1.value);
    local_5c8.ownFile.content.ptr = local_178.ownFile.content.ptr;
    local_5c8.ownFile.content.size_ = local_178.ownFile.content.size_;
    local_5c8.ownFile.content.disposer = local_178.ownFile.content.disposer;
    local_178.ownFile.content.ptr = (char *)0x0;
    local_178.ownFile.content.size_ = 0;
    local_5c8.file = local_178.file;
    local_5c8.line = local_178.line;
    local_5c8.type = local_178.type;
    local_5c8.description.content.ptr = local_178.description.content.ptr;
    local_5c8.description.content.size_ = local_178.description.content.size_;
    local_178.description.content.ptr = (char *)0x0;
    local_178.description.content.size_ = 0;
    local_5c8.description.content.disposer = local_178.description.content.disposer;
    local_5c8.context.ptr.disposer = local_178.context.ptr.disposer;
    local_5c8.context.ptr.ptr = local_178.context.ptr.ptr;
    local_178.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5c8.trace,local_178.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_2f8,&local_5c8);
    local_2f8.value.ptr.isSet = false;
    Exception::~Exception(&local_5c8);
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_2f8);
    ExceptionOr<kj::String>::~ExceptionOr(&local_2f8);
    Exception::~Exception(&local_178);
  }
  else if (local_308 == '\x01') {
    anon_class_8_1_8ba005cd_for_func::operator()(&local_5c8.ownFile,&this->func,local_300);
    local_2f8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2f8.value.ptr.isSet = true;
    local_2f8.value.ptr.field_1.value.content.ptr = local_5c8.ownFile.content.ptr;
    local_2f8.value.ptr.field_1.value.content.size_ = local_5c8.ownFile.content.size_;
    local_2f8.value.ptr.field_1.value.content.disposer = local_5c8.ownFile.content.disposer;
    local_5c8.ownFile.content.ptr = (char *)0x0;
    local_5c8.ownFile.content.size_ = 0;
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_2f8);
    ExceptionOr<kj::String>::~ExceptionOr(&local_2f8);
    Array<char>::~Array((Array<char> *)&local_5c8);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_468);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }